

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

string * __thiscall
iDynTree::Model::getJointName_abi_cxx11_
          (string *__return_storage_ptr__,Model *this,JointIndex jointIndex)

{
  ostream *poVar1;
  stringstream ss;
  char *local_1c0 [4];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if ((jointIndex < 0) ||
     ((long)(this->joints).
            super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->joints).
            super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 <= jointIndex)) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar1 = std::operator<<(local_190,"jointIndex ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    poVar1 = std::operator<<(poVar1," is not valid, should be between 0 and ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("Model","getJointName",local_1c0[0]);
    std::__cxx11::string::~string((string *)local_1c0);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)JOINT_INVALID_NAME_abi_cxx11_);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               ((this->jointNames).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + jointIndex));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Model::getJointName(const JointIndex jointIndex) const
{
    if( jointIndex >= 0 && jointIndex < (JointIndex)this->getNrOfJoints() )
    {
        return jointNames[jointIndex];
    }
    else
    {
        std::stringstream ss;
        ss << "jointIndex " << jointIndex << " is not valid, should be between 0 and " << this->getNrOfJoints()-1;
        reportError("Model","getJointName",ss.str().c_str());
        return JOINT_INVALID_NAME;
    }
}